

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void VaxpyVectorArray_Serial(int nvec,sunrealtype a,N_Vector *X,N_Vector *Y)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = *(*X)->content;
  uVar4 = 0;
  if ((a != 1.0) || (NAN(a))) {
    if ((long)uVar3 < 1) {
      uVar3 = uVar4;
    }
    if (0 < nvec) {
      uVar4 = (ulong)(uint)nvec;
    }
    uVar5 = 0;
    if ((a != -1.0) || (NAN(a))) {
      for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        lVar1 = *(long *)((long)X[uVar5]->content + 0x10);
        lVar2 = *(long *)((long)Y[uVar5]->content + 0x10);
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          *(double *)(lVar2 + uVar6 * 8) =
               *(double *)(lVar1 + uVar6 * 8) * a + *(double *)(lVar2 + uVar6 * 8);
        }
      }
    }
    else {
      for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        lVar1 = *(long *)((long)X[uVar5]->content + 0x10);
        lVar2 = *(long *)((long)Y[uVar5]->content + 0x10);
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          *(double *)(lVar2 + uVar6 * 8) =
               *(double *)(lVar2 + uVar6 * 8) - *(double *)(lVar1 + uVar6 * 8);
        }
      }
    }
  }
  else {
    if ((long)uVar3 < 1) {
      uVar3 = uVar4;
    }
    uVar5 = (ulong)(uint)nvec;
    if (nvec < 1) {
      uVar5 = uVar4;
    }
    for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
      lVar1 = *(long *)((long)X[uVar4]->content + 0x10);
      lVar2 = *(long *)((long)Y[uVar4]->content + 0x10);
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        *(double *)(lVar2 + uVar6 * 8) =
             *(double *)(lVar1 + uVar6 * 8) + *(double *)(lVar2 + uVar6 * 8);
      }
    }
  }
  return;
}

Assistant:

static void VaxpyVectorArray_Serial(int nvec, sunrealtype a, N_Vector* X,
                                    N_Vector* Y)
{
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;

  N = NV_LENGTH_S(X[0]);

  if (a == ONE)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] += xd[j]; }
    }
    return;
  }

  if (a == -ONE)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] -= xd[j]; }
    }
    return;
  }

  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    for (j = 0; j < N; j++) { yd[j] += a * xd[j]; }
  }
}